

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

void do_stack_frame(CPUM68KState_conflict *env,uint32_t *sp,uint16_t format,uint16_t sr,
                   uint32_t addr,uint32_t retaddr)

{
  uint32_t uVar1;
  
  if ((env->features & 0x40000) == 0) goto LAB_0066df17;
  if (format - 2 < 2) {
LAB_0066ded8:
    uVar1 = *sp;
    *sp = uVar1 - 4;
    cpu_stl_mmuidx_ra_m68k(env,uVar1 - 4,addr,0,0);
  }
  else if (format == 4) {
    uVar1 = *sp;
    *sp = uVar1 - 4;
    cpu_stl_mmuidx_ra_m68k(env,uVar1 - 4,env->pc,0,0);
    goto LAB_0066ded8;
  }
  uVar1 = *sp;
  *sp = uVar1 - 2;
  cpu_stw_mmuidx_ra_m68k(env,uVar1 - 2,(uint)format * 0x1000 + *(int *)(env[-3].fregs + 2) * 4,0,0);
LAB_0066df17:
  uVar1 = *sp;
  *sp = uVar1 - 4;
  cpu_stl_mmuidx_ra_m68k(env,uVar1 - 4,retaddr,0,0);
  uVar1 = *sp;
  *sp = uVar1 - 2;
  cpu_stw_mmuidx_ra_m68k(env,uVar1 - 2,(uint)sr,0,0);
  return;
}

Assistant:

static inline void do_stack_frame(CPUM68KState *env, uint32_t *sp,
                                  uint16_t format, uint16_t sr,
                                  uint32_t addr, uint32_t retaddr)
{
    if (m68k_feature(env, M68K_FEATURE_QUAD_MULDIV)) {
        /*  all except 68000 */
        CPUState *cs = env_cpu(env);
        switch (format) {
        case 4:
            *sp -= 4;
            cpu_stl_mmuidx_ra(env, *sp, env->pc, MMU_KERNEL_IDX, 0);
            *sp -= 4;
            cpu_stl_mmuidx_ra(env, *sp, addr, MMU_KERNEL_IDX, 0);
            break;
        case 3:
        case 2:
            *sp -= 4;
            cpu_stl_mmuidx_ra(env, *sp, addr, MMU_KERNEL_IDX, 0);
            break;
        }
        *sp -= 2;
        cpu_stw_mmuidx_ra(env, *sp, (format << 12) + (cs->exception_index << 2),
                          MMU_KERNEL_IDX, 0);
    }
    *sp -= 4;
    cpu_stl_mmuidx_ra(env, *sp, retaddr, MMU_KERNEL_IDX, 0);
    *sp -= 2;
    cpu_stw_mmuidx_ra(env, *sp, sr, MMU_KERNEL_IDX, 0);
}